

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8272.cpp
# Opt level: O1

void __thiscall Intel::i8272::i8272::run_for(i8272 *this,Cycles cycles)

{
  Observer *pOVar1;
  bool bVar2;
  int timers_left;
  int iVar3;
  uint uVar4;
  long lVar5;
  Drive *pDVar6;
  int iVar7;
  long lVar8;
  Drive *pDVar9;
  uint uVar10;
  uint uVar11;
  int c;
  ulong uVar12;
  LogLine local_48;
  Drive *local_40;
  WrappedInt<Cycles> local_38;
  
  Storage::Disk::Controller::run_for((Controller *)this,cycles);
  if (this->is_sleeping_ == false) {
    lVar5 = this->delay_time_;
    if (0 < lVar5) {
      if (lVar5 - (long)cycles.super_WrappedInt<Cycles>.length_ == 0 ||
          lVar5 < (long)cycles.super_WrappedInt<Cycles>.length_) {
        this->delay_time_ = 0;
        posit_event(this,0x10);
      }
      else {
        this->delay_time_ = lVar5 - (long)cycles.super_WrappedInt<Cycles>.length_;
      }
    }
    iVar3 = this->drives_seeking_;
    if (iVar3 != 0) {
      pDVar9 = this->drives_;
      uVar12 = 0;
      local_40 = pDVar9;
      local_38 = cycles.super_WrappedInt<Cycles>.length_;
      do {
        if (pDVar9[uVar12].phase == Seeking) {
          pDVar9 = pDVar9 + uVar12;
          lVar5 = pDVar9->step_rate_counter + (long)cycles.super_WrappedInt<Cycles>.length_;
          pDVar9->step_rate_counter = lVar5;
          lVar8 = (long)this->step_rate_time_ * 8000;
          pDVar9->step_rate_counter = lVar5 % lVar8;
          lVar5 = lVar5 / lVar8 + 1;
          do {
            lVar5 = lVar5 + -1;
            if (lVar5 == 0) goto LAB_00189fb3;
            bVar2 = (int)(uint)pDVar9->head_position <= pDVar9->target_head_position;
            local_48.stream_ = (FILE *)_stdout;
            fprintf(_stdout,"[%s] ","i8272");
            Log::Logger<(Log::Source)13>::LogLine::append
                      (&local_48,"Target %d versus believed %d",
                       (ulong)(uint)pDVar9->target_head_position,(ulong)pDVar9->head_position);
            fputc(10,(FILE *)local_48.stream_);
            (*(this->super_MFMController).super_Controller.super_Source._vptr_Source[8])
                      (this,uVar12 & 0xffffffff);
            pDVar6 = Storage::Disk::Controller::get_drive((Controller *)this);
            Storage::Disk::Drive::step(pDVar6,(HeadPosition)((uint)bVar2 * 8 + -4));
            if (-1 < pDVar9->target_head_position) {
              pDVar9->head_position = pDVar9->head_position + bVar2 * '\x02' + -1;
            }
            bVar2 = seek_is_satisfied(this,(int)uVar12);
          } while (!bVar2);
          pDVar9->phase = CompletedSeeking;
          this->drives_seeking_ = this->drives_seeking_ + -1;
LAB_00189fb3:
          iVar3 = iVar3 + -1;
          pDVar9 = local_40;
          cycles.super_WrappedInt<Cycles>.length_ = local_38;
          if (iVar3 == 0) break;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 4);
    }
    iVar3 = this->head_timers_running_;
    if (iVar3 != 0) {
      iVar7 = this->head_timers_running_;
      uVar4 = 0;
      do {
        uVar11 = uVar4 >> 1;
        uVar10 = uVar4 & 1;
        lVar5 = this->drives_[uVar11].head_unload_delay[uVar10];
        if (lVar5 < 1) {
          bVar2 = false;
        }
        else {
          if (lVar5 - (long)cycles.super_WrappedInt<Cycles>.length_ == 0 ||
              lVar5 < (long)cycles.super_WrappedInt<Cycles>.length_) {
            this->drives_[uVar11].head_unload_delay[uVar10] = 0;
            this->drives_[uVar11].head_is_loaded[uVar10] = false;
            iVar7 = iVar7 + -1;
            this->head_timers_running_ = iVar7;
          }
          else {
            this->drives_[uVar11].head_unload_delay[uVar10] =
                 lVar5 - (long)cycles.super_WrappedInt<Cycles>.length_;
          }
          iVar3 = iVar3 + -1;
          bVar2 = iVar3 == 0;
        }
      } while ((!bVar2) && (bVar2 = uVar4 != 7, uVar4 = uVar4 + 1, bVar2));
    }
    if (this->is_executing_ == true) {
      pDVar6 = Storage::Disk::Controller::get_drive((Controller *)this);
      bVar2 = Storage::Disk::Drive::get_is_ready(pDVar6);
      if (!bVar2) {
        posit_event(this,0x40);
      }
    }
    if ((this->delay_time_ == 0) && (this->drives_seeking_ == 0)) {
      bVar2 = this->head_timers_running_ == 0;
      this->is_sleeping_ = bVar2;
      if ((bVar2) &&
         (pOVar1 = (this->super_MFMController).super_Controller.super_Source.observer_,
         pOVar1 != (Observer *)0x0)) {
        uVar4 = (**(this->super_MFMController).super_Controller.super_Source._vptr_Source)(this);
        (**pOVar1->_vptr_Observer)(pOVar1,this,(ulong)uVar4);
      }
    }
    else {
      this->is_sleeping_ = false;
    }
  }
  return;
}

Assistant:

void i8272::run_for(Cycles cycles) {
	Storage::Disk::MFMController::run_for(cycles);

	if(is_sleeping_) return;

	// check for an expired timer
	if(delay_time_ > 0) {
		if(cycles.as_integral() >= delay_time_) {
			delay_time_ = 0;
			posit_event(int(Event8272::Timer));
		} else {
			delay_time_ -= cycles.as_integral();
		}
	}

	// update seek status of any drives presently seeking
	if(drives_seeking_) {
		int drives_left = drives_seeking_;
		for(int c = 0; c < 4; c++) {
			if(drives_[c].phase == Drive::Seeking) {
				drives_[c].step_rate_counter += cycles.as_integral();
				auto steps = drives_[c].step_rate_counter / (8000 * step_rate_time_);
				drives_[c].step_rate_counter %= (8000 * step_rate_time_);
				while(steps--) {
					// Perform a step.
					int direction = (drives_[c].target_head_position < drives_[c].head_position) ? -1 : 1;
					logger.info().append("Target %d versus believed %d", drives_[c].target_head_position, drives_[c].head_position);
					select_drive(c);
					get_drive().step(Storage::Disk::HeadPosition(direction));
					if(drives_[c].target_head_position >= 0) drives_[c].head_position += direction;

					// Check for completion.
					if(seek_is_satisfied(c)) {
						drives_[c].phase = Drive::CompletedSeeking;
						drives_seeking_--;
						break;
					}
				}

				drives_left--;
				if(!drives_left) break;
			}
		}
	}

	// check for any head unloads
	if(head_timers_running_) {
		int timers_left = head_timers_running_;
		for(int c = 0; c < 8; c++) {
			int drive = (c >> 1);
			int head = c&1;

			if(drives_[drive].head_unload_delay[head] > 0) {
				if(cycles.as_integral() >= drives_[drive].head_unload_delay[head]) {
					drives_[drive].head_unload_delay[head] = 0;
					drives_[drive].head_is_loaded[head] = false;
					head_timers_running_--;
				} else {
					drives_[drive].head_unload_delay[head] -= cycles.as_integral();
				}
				timers_left--;
				if(!timers_left) break;
			}
		}
	}

	// check for busy plus ready disabled
	if(is_executing_ && !get_drive().get_is_ready()) {
		posit_event(int(Event8272::NoLongerReady));
	}

	is_sleeping_ = !delay_time_ && !drives_seeking_ && !head_timers_running_;
	if(is_sleeping_) update_clocking_observer();
}